

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void page_lock_pair(uc_struct_conflict15 *uc,PageDesc **ret_p1,tb_page_addr_t phys1,
                   PageDesc **ret_p2,tb_page_addr_t phys2,int alloc)

{
  PageDesc *pPVar1;
  
  if (phys1 != 0xffffffffffffffff) {
    pPVar1 = page_find_alloc(uc,phys1 >> 0xe,alloc);
    if (ret_p1 != (PageDesc **)0x0) {
      *ret_p1 = pPVar1;
    }
    if (phys2 != 0xffffffffffffffff) {
      if (phys1 >> 0xe != phys2 >> 0xe) {
        pPVar1 = page_find_alloc(uc,phys2 >> 0xe,alloc);
      }
      if (ret_p2 != (PageDesc **)0x0) {
        *ret_p2 = pPVar1;
      }
    }
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/translate-all.c"
             ,0x2cc,"phys1 != -1");
}

Assistant:

static void page_lock_pair(struct uc_struct *uc, PageDesc **ret_p1, tb_page_addr_t phys1,
                           PageDesc **ret_p2, tb_page_addr_t phys2, int alloc)
{
    PageDesc *p1, *p2;
    tb_page_addr_t page1;
    tb_page_addr_t page2;

    assert_memory_lock();
    g_assert(phys1 != -1);

    page1 = phys1 >> TARGET_PAGE_BITS;
    page2 = phys2 >> TARGET_PAGE_BITS;

    p1 = page_find_alloc(uc, page1, alloc);
    if (ret_p1) {
        *ret_p1 = p1;
    }
    if (likely(phys2 == -1)) {
        page_lock(p1);
        return;
    } else if (page1 == page2) {
        page_lock(p1);
        if (ret_p2) {
            *ret_p2 = p1;
        }
        return;
    }
    p2 = page_find_alloc(uc, page2, alloc);
    if (ret_p2) {
        *ret_p2 = p2;
    }
    if (page1 < page2) {
        page_lock(p1);
        page_lock(p2);
    } else {
        page_lock(p2);
        page_lock(p1);
    }
}